

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O0

void __thiscall Assimp::ExporterPimpl::~ExporterPimpl(ExporterPimpl *this)

{
  aiExportDataBlob *this_00;
  size_type sVar1;
  reference ppBVar2;
  uint local_14;
  uint a;
  ExporterPimpl *this_local;
  
  this_00 = this->blob;
  if (this_00 != (aiExportDataBlob *)0x0) {
    aiExportDataBlob::~aiExportDataBlob(this_00);
    operator_delete(this_00,0x420);
  }
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::size
                      (&this->mPostProcessingSteps);
    if (sVar1 <= local_14) break;
    ppBVar2 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::operator[]
                        (&this->mPostProcessingSteps,(ulong)local_14);
    if (*ppBVar2 != (value_type)0x0) {
      (*(*ppBVar2)->_vptr_BaseProcess[1])();
    }
    local_14 = local_14 + 1;
  }
  if (this->mProgressHandler != (ProgressHandler *)0x0) {
    (*this->mProgressHandler->_vptr_ProgressHandler[1])();
  }
  std::
  vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
  ::~vector(&this->mExporters);
  std::__cxx11::string::~string((string *)&this->mError);
  std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::~vector
            (&this->mPostProcessingSteps);
  std::shared_ptr<Assimp::IOSystem>::~shared_ptr(&this->mIOSystem);
  return;
}

Assistant:

~ExporterPimpl() {
        delete blob;

        // Delete all post-processing plug-ins
        for( unsigned int a = 0; a < mPostProcessingSteps.size(); a++) {
            delete mPostProcessingSteps[a];
        }
        delete mProgressHandler;
    }